

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::(anonymous_namespace)::
     FloatToBufferImpl<unsigned_long,long_double,(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
               (unsigned_long int_mantissa,int exp,size_t precision,Buffer *out,int *exp_out)

{
  int *this;
  char cVar1;
  size_t sVar2;
  undefined1 auStack_80 [7];
  char next_digit;
  anon_class_24_3_e8342906 get_next_digit;
  size_t fractional_count;
  size_t digits_printed;
  unsigned_long mask;
  size_t digits_to_zero_pad;
  size_t digits_printed_1;
  int *piStack_38;
  int int_bits;
  int *exp_out_local;
  Buffer *out_local;
  size_t precision_local;
  unsigned_long uStack_18;
  int exp_local;
  unsigned_long int_mantissa_local;
  
  digits_printed_1._4_4_ = 0x40;
  out->end = out->data + 0x29;
  out->begin = out->data + 0x29;
  piStack_38 = exp_out;
  exp_out_local = (int *)out;
  out_local = (Buffer *)precision;
  uStack_18 = int_mantissa;
  if (exp < 0) {
    precision_local._4_4_ = -exp;
    if (precision_local._4_4_ < 0x3d) {
      digits_printed = (1L << ((byte)precision_local._4_4_ & 0x3f)) - 1;
      sVar2 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                        (int_mantissa >> ((byte)precision_local._4_4_ & 0x3f),out);
      uStack_18 = digits_printed & uStack_18;
      get_next_digit.mask = (unsigned_long *)out_local;
      if (sVar2 == 0) {
        *piStack_38 = 0;
        if (uStack_18 != 0) {
          while (uStack_18 <= digits_printed) {
            uStack_18 = uStack_18 * 10;
            *piStack_38 = *piStack_38 + -1;
          }
        }
        anon_unknown_0::Buffer::push_front
                  ((Buffer *)exp_out_local,
                   (char)(uStack_18 >> ((byte)precision_local._4_4_ & 0x3f)) + '0');
        anon_unknown_0::Buffer::push_back((Buffer *)exp_out_local,'.');
        uStack_18 = digits_printed & uStack_18;
      }
      else {
        *piStack_38 = (int)sVar2 + -1;
        if (out_local < (Buffer *)(sVar2 - 1)) {
          anon_unknown_0::RemoveExtraPrecision
                    ((sVar2 - 1) - (long)out_local,uStack_18 != 0,(Buffer *)exp_out_local,piStack_38
                    );
          return true;
        }
        get_next_digit.mask = (unsigned_long *)((long)out_local - (sVar2 - 1));
      }
      _auStack_80 = &stack0xffffffffffffffe8;
      get_next_digit.int_mantissa = (unsigned_long *)((long)&precision_local + 4);
      get_next_digit.exp = (int *)&digits_printed;
      for (; this = exp_out_local, get_next_digit.mask != (unsigned_long *)0x0;
          get_next_digit.mask = (unsigned_long *)((long)get_next_digit.mask + -1)) {
        cVar1 = anon_unknown_0::
                FloatToBufferImpl<unsigned_long,_long_double,_(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
                ::anon_class_24_3_e8342906::operator()((anon_class_24_3_e8342906 *)auStack_80);
        anon_unknown_0::Buffer::push_back((Buffer *)this,cVar1 + '0');
      }
      cVar1 = anon_unknown_0::
              FloatToBufferImpl<unsigned_long,_long_double,_(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
              ::anon_class_24_3_e8342906::operator()((anon_class_24_3_e8342906 *)auStack_80);
      if (('\x05' < cVar1) ||
         ((cVar1 == '\x05' &&
          ((uStack_18 != 0 ||
           (cVar1 = anon_unknown_0::Buffer::last_digit((Buffer *)exp_out_local), (int)cVar1 % 2 == 1
           )))))) {
        anon_unknown_0::
        RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
                  ((Buffer *)exp_out_local,piStack_38);
      }
      int_mantissa_local._7_1_ = true;
    }
    else {
      int_mantissa_local._7_1_ = false;
    }
  }
  else if (exp + 0x40 < 0x41) {
    precision_local._4_4_ = exp;
    digits_to_zero_pad =
         PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                   (int_mantissa << ((byte)exp & 0x3f),out);
    mask = (unsigned_long)out_local;
    *piStack_38 = (int)digits_to_zero_pad + -1;
    if (out_local < (Buffer *)(digits_to_zero_pad - 1)) {
      anon_unknown_0::RemoveExtraPrecision
                ((digits_to_zero_pad - 1) - (long)out_local,false,(Buffer *)exp_out_local,piStack_38
                );
      int_mantissa_local._7_1_ = true;
    }
    else {
      mask = (long)out_local - (digits_to_zero_pad - 1);
      while (mask != 0) {
        mask = mask - 1;
        anon_unknown_0::Buffer::push_back((Buffer *)exp_out_local,'0');
      }
      int_mantissa_local._7_1_ = true;
    }
  }
  else {
    int_mantissa_local._7_1_ = false;
  }
  return int_mantissa_local._7_1_;
}

Assistant:

bool FloatToBufferImpl(Int int_mantissa,
                       int exp,
                       size_t precision,
                       Buffer* out,
                       int* exp_out) {
  assert((CanFitMantissa<Float, Int>()));

  const int int_bits = std::numeric_limits<Int>::digits;

  // In precision mode, we start printing one char to the right because it will
  // also include the '.'
  // In fixed mode we put the dot afterwards on the right.
  out->begin = out->end =
      out->data + 1 + kMaxFixedPrecision + (mode == FormatStyle::Precision);

  if (exp >= 0) {
    if (std::numeric_limits<Float>::digits + exp > int_bits) {
      // The value will overflow the Int
      return false;
    }
    size_t digits_printed = PrintIntegralDigits<mode>(int_mantissa << exp, out);
    size_t digits_to_zero_pad = precision;
    if (mode == FormatStyle::Precision) {
      *exp_out = static_cast<int>(digits_printed - 1);
      if (digits_to_zero_pad < digits_printed - 1) {
        RemoveExtraPrecision(digits_printed - 1 - digits_to_zero_pad, false,
                             out, exp_out);
        return true;
      }
      digits_to_zero_pad -= digits_printed - 1;
    }
    for (; digits_to_zero_pad-- > 0;) out->push_back('0');
    return true;
  }

  exp = -exp;
  // We need at least 4 empty bits for the next decimal digit.
  // We will multiply by 10.
  if (exp > int_bits - 4) return false;

  const Int mask = (Int{1} << exp) - 1;

  // Print the integral part first.
  size_t digits_printed = PrintIntegralDigits<mode>(int_mantissa >> exp, out);
  int_mantissa &= mask;

  size_t fractional_count = precision;
  if (mode == FormatStyle::Precision) {
    if (digits_printed == 0) {
      // Find the first non-zero digit, when in Precision mode.
      *exp_out = 0;
      if (int_mantissa) {
        while (int_mantissa <= mask) {
          int_mantissa *= 10;
          --*exp_out;
        }
      }
      out->push_front(static_cast<char>(int_mantissa >> exp) + '0');
      out->push_back('.');
      int_mantissa &= mask;
    } else {
      // We already have a digit, and a '.'
      *exp_out = static_cast<int>(digits_printed - 1);
      if (fractional_count < digits_printed - 1) {
        // If we had enough digits, return right away.
        // The code below will try to round again otherwise.
        RemoveExtraPrecision(digits_printed - 1 - fractional_count,
                             int_mantissa != 0, out, exp_out);
        return true;
      }
      fractional_count -= digits_printed - 1;
    }
  }

  auto get_next_digit = [&] {
    int_mantissa *= 10;
    char digit = static_cast<char>(int_mantissa >> exp);
    int_mantissa &= mask;
    return digit;
  };

  // Print fractional_count more digits, if available.
  for (; fractional_count > 0; --fractional_count) {
    out->push_back(get_next_digit() + '0');
  }

  char next_digit = get_next_digit();
  if (next_digit > 5 ||
      (next_digit == 5 && (int_mantissa || out->last_digit() % 2 == 1))) {
    RoundUp<mode>(out, exp_out);
  }

  return true;
}